

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# items.cpp
# Opt level: O2

void __thiscall CItems::RenderProjectile(CItems *this,CNetObj_Projectile *pCurrent,int ItemID)

{
  int iVar1;
  long lVar2;
  CNetObj_GameData *pCVar3;
  CEffects *this_00;
  IGraphics *pIVar4;
  undefined1 auVar5 [12];
  vec2 Pos;
  bool bVar6;
  uint uVar7;
  int iVar8;
  CGameClient *pCVar9;
  long in_FS_OFFSET;
  float fVar10;
  float fVar11;
  undefined1 extraout_var [12];
  undefined1 auVar12 [16];
  undefined4 uVar13;
  anon_union_4_2_94730284_for_vector2_base<float>_1 aVar14;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aVar18;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float fVar19;
  anon_union_4_2_94730284_for_vector2_base<float>_1 aVar20;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aVar21;
  undefined1 local_b8 [16];
  undefined8 local_40;
  undefined8 uStack_38;
  vec2 Vel;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  uVar7 = pCurrent->m_Type - 1;
  local_b8 = ZEXT816(0);
  if (uVar7 < 3) {
    pCVar9 = (this->super_CComponent).m_pClient;
    auVar17._0_4_ =
         (float)*(int *)((long)(pCVar9->m_All).m_paComponents +
                        *(long *)(&DAT_001c9eb8 + (ulong)uVar7 * 8) + -0x10);
    auVar17._4_4_ =
         (float)*(int *)((long)(pCVar9->m_All).m_paComponents +
                        *(long *)(&DAT_001c9ed0 + (ulong)uVar7 * 8) + -0x10);
    auVar17._8_8_ = 0;
    local_b8 = divps(auVar17,_DAT_001c9e00);
  }
  if ((RenderProjectile(CNetObj_Projectile_const*,int)::s_LastGameTickTime == '\0') &&
     (iVar8 = __cxa_guard_acquire(&RenderProjectile(CNetObj_Projectile_const*,int)::
                                   s_LastGameTickTime), iVar8 != 0)) {
    RenderProjectile::s_LastGameTickTime =
         ((this->super_CComponent).m_pClient)->m_pClient->m_GameTickTime;
    __cxa_guard_release(&RenderProjectile(CNetObj_Projectile_const*,int)::s_LastGameTickTime);
  }
  pCVar9 = (this->super_CComponent).m_pClient;
  pCVar3 = (pCVar9->m_Snap).m_pGameData;
  if ((pCVar3 == (CNetObj_GameData *)0x0) || ((pCVar3->m_GameStateFlags & 0x1c) == 0)) {
    bVar6 = CGameClient::IsDemoPlaybackPaused(pCVar9);
    pCVar9 = (this->super_CComponent).m_pClient;
    if (!bVar6) {
      RenderProjectile::s_LastGameTickTime = pCVar9->m_pClient->m_GameTickTime;
    }
  }
  bVar6 = CGameClient::ShouldUsePredicted(pCVar9);
  pCVar9 = (this->super_CComponent).m_pClient;
  if ((bVar6) && (pCVar9->m_pConfig->m_ClPredictProjectiles != 0)) {
    fVar10 = ((float)(~pCurrent->m_StartTick + pCVar9->m_pClient->m_PredTick) +
             pCVar9->m_pClient->m_PredIntraTick) / 50.0;
  }
  else {
    fVar10 = (float)(pCVar9->m_pClient->m_PrevGameTick - pCurrent->m_StartTick) / 50.0 +
             RenderProjectile::s_LastGameTickTime;
  }
  if ((0.0 <= fVar10) ||
     (bVar6 = RenderProjectile::s_LastGameTickTime * -0.5 < fVar10, fVar10 = 0.0, bVar6)) {
    iVar8 = pCurrent->m_X;
    iVar1 = pCurrent->m_Y;
    fVar11 = (float)pCurrent->m_VelY / 100.0;
    uVar13 = local_b8._0_4_;
    fVar19 = local_b8._4_4_ * fVar10;
    auVar5._4_8_ = local_b8._8_8_;
    auVar5._0_4_ = uVar13;
    auVar15._0_8_ = auVar5._0_8_ << 0x20;
    auVar15._8_4_ = uVar13;
    auVar15._12_4_ = uVar13;
    auVar16._4_12_ = auVar15._4_12_;
    auVar16._0_4_ = (float)pCurrent->m_VelX;
    auVar17 = divps(auVar16,_DAT_001c9e10);
    aVar20.x = fVar19 * auVar17._0_4_ + (float)iVar8;
    aVar21.y = fVar19 * fVar19 * auVar17._4_4_ + fVar11 * fVar19 + (float)iVar1;
    (*(pCVar9->m_pGraphics->super_IInterface)._vptr_IInterface[0x13])
              (pCVar9->m_pGraphics,(ulong)(uint)g_pData->m_aImages[1].m_Id.m_Id);
    (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])
              ();
    uVar7 = 5;
    if (pCurrent->m_Type < 5) {
      uVar7 = pCurrent->m_Type;
    }
    if ((int)uVar7 < 1) {
      uVar7 = 0;
    }
    CRenderTools::SelectSprite
              (&((this->super_CComponent).m_pClient)->m_RenderTools,
               (g_pData->m_Weapons).m_aId[uVar7].m_pSpriteProj,0,0,0);
    fVar10 = (fVar10 + -0.001) * local_b8._4_4_;
    Pos.field_1.y = aVar21.y;
    Pos.field_0.x = aVar20.x;
    aVar14.x = aVar20.x - (fVar10 * auVar17._0_4_ + (float)iVar8);
    aVar18.y = aVar21.y - (fVar10 * fVar10 * auVar17._4_4_ + fVar11 * fVar10 + (float)iVar1);
    this_00 = ((this->super_CComponent).m_pClient)->m_pEffects;
    Vel.field_0.x = aVar14.x;
    Vel.field_1.y = aVar18.y;
    if (pCurrent->m_Type == 3) {
      CEffects::SmokeTrail(this_00,Pos,(vec2)(CONCAT44(aVar18,aVar14) ^ 0x8000000080000000));
      fVar10 = ((this->super_CComponent).m_pClient)->m_pClient->m_LocalTime;
      if ((RenderProjectile(CNetObj_Projectile_const*,int)::s_LastLocalTime == '\0') &&
         (iVar8 = __cxa_guard_acquire(&RenderProjectile(CNetObj_Projectile_const*,int)::
                                       s_LastLocalTime), iVar8 != 0)) {
        RenderProjectile::s_LastLocalTime = fVar10;
        __cxa_guard_release(&RenderProjectile(CNetObj_Projectile_const*,int)::s_LastLocalTime);
      }
      fVar11 = fVar10 - RenderProjectile::s_LastLocalTime;
      fVar19 = CGameClient::GetAnimationPlaybackSpeed((this->super_CComponent).m_pClient);
      RenderProjectile::s_Time = fVar19 * fVar11 + RenderProjectile::s_Time;
      fVar11 = RenderProjectile::s_Time * 3.1415927 + RenderProjectile::s_Time * 3.1415927;
      auVar12._0_4_ = fVar11 + fVar11 + (float)ItemID;
      auVar12._4_12_ = extraout_var;
      (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x19]
      )(auVar12._0_8_);
      RenderProjectile::s_LastLocalTime = fVar10;
    }
    else {
      CEffects::BulletTrail(this_00,Pos);
      pIVar4 = ((this->super_CComponent).m_pClient)->m_pGraphics;
      if (1e-05 < SQRT(aVar14.x * aVar14.x + aVar18.y * aVar18.y)) {
        angle(&Vel);
      }
      (*(pIVar4->super_IInterface)._vptr_IInterface[0x19])(pIVar4);
    }
    local_40 = CONCAT44(aVar21,aVar20);
    uStack_38 = 0x4200000042000000;
    pIVar4 = ((this->super_CComponent).m_pClient)->m_pGraphics;
    (*(pIVar4->super_IInterface)._vptr_IInterface[0x1c])(pIVar4,&local_40,1);
    (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x19])
              ();
    (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])
              ();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CItems::RenderProjectile(const CNetObj_Projectile *pCurrent, int ItemID)
{
	// get positions
	float Curvature = 0;
	float Speed = 0;
	if(pCurrent->m_Type == WEAPON_GRENADE)
	{
		Curvature = m_pClient->m_Tuning.m_GrenadeCurvature;
		Speed = m_pClient->m_Tuning.m_GrenadeSpeed;
	}
	else if(pCurrent->m_Type == WEAPON_SHOTGUN)
	{
		Curvature = m_pClient->m_Tuning.m_ShotgunCurvature;
		Speed = m_pClient->m_Tuning.m_ShotgunSpeed;
	}
	else if(pCurrent->m_Type == WEAPON_GUN)
	{
		Curvature = m_pClient->m_Tuning.m_GunCurvature;
		Speed = m_pClient->m_Tuning.m_GunSpeed;
	}

	static float s_LastGameTickTime = Client()->GameTickTime();
	if(!m_pClient->IsWorldPaused() && !m_pClient->IsDemoPlaybackPaused())
		s_LastGameTickTime = Client()->GameTickTime();

	float Ct;
	if(m_pClient->ShouldUsePredicted() && Config()->m_ClPredictProjectiles)
		Ct = ((float)(Client()->PredGameTick() - 1 - pCurrent->m_StartTick) + Client()->PredIntraGameTick())/(float)SERVER_TICK_SPEED;
	else
		Ct = (Client()->PrevGameTick()-pCurrent->m_StartTick)/(float)SERVER_TICK_SPEED + s_LastGameTickTime;
	if(Ct < 0)
	{
		if(Ct > -s_LastGameTickTime / 2)
		{
			// Fixup the timing which might be screwed during demo playback because
			// s_LastGameTickTime depends on the system timer, while the other part
			// Client()->PrevGameTick()-pCurrent->m_StartTick)/(float)SERVER_TICK_SPEED
			// is virtually constant (for projectiles fired on the current game tick):
			// (x - (x+2)) / 50 = -0.04
			//
			// We have a strict comparison for the passed time being more than the time between ticks
			// if(CurtickStart > m_Info.m_CurrentTime) in CDemoPlayer::Update()
			// so on the practice the typical value of s_LastGameTickTime varies from 0.02386 to 0.03999
			// which leads to Ct from -0.00001 to -0.01614.
			// Round up those to 0.0 to fix missing rendering of the projectile.
			Ct = 0;
		}
		else
		{
			return; // projectile haven't been shot yet
		}
	}

	vec2 StartPos(pCurrent->m_X, pCurrent->m_Y);
	vec2 StartVel(pCurrent->m_VelX/100.0f, pCurrent->m_VelY/100.0f);
	vec2 Pos = CalcPos(StartPos, StartVel, Curvature, Speed, Ct);
	vec2 PrevPos = CalcPos(StartPos, StartVel, Curvature, Speed, Ct-0.001f);

	Graphics()->TextureSet(g_pData->m_aImages[IMAGE_GAME].m_Id);
	Graphics()->QuadsBegin();

	RenderTools()->SelectSprite(g_pData->m_Weapons.m_aId[clamp(pCurrent->m_Type, 0, NUM_WEAPONS-1)].m_pSpriteProj);
	const vec2 Vel = Pos-PrevPos;

	// add particle for this projectile
	if(pCurrent->m_Type == WEAPON_GRENADE)
	{
		m_pClient->m_pEffects->SmokeTrail(Pos, Vel*-1);
		const float Now = Client()->LocalTime();
		static float s_Time = 0.0f;
		static float s_LastLocalTime = Now;
		s_Time += (Now - s_LastLocalTime) * m_pClient->GetAnimationPlaybackSpeed();
		Graphics()->QuadsSetRotation(s_Time*pi*2*2 + ItemID);
		s_LastLocalTime = Now;
	}
	else
	{
		m_pClient->m_pEffects->BulletTrail(Pos);
		Graphics()->QuadsSetRotation(length(Vel) > 0.00001f ? angle(Vel) : 0);
	}

	IGraphics::CQuadItem QuadItem(Pos.x, Pos.y, 32, 32);
	Graphics()->QuadsDraw(&QuadItem, 1);
	Graphics()->QuadsSetRotation(0);
	Graphics()->QuadsEnd();
}